

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasinterval.cpp
# Opt level: O0

BOOL __thiscall LASinterval::get_cell(LASinterval *this,I32 c_index)

{
  bool bVar1;
  reference ppVar2;
  _Node_iterator_base<std::pair<const_int,_LASintervalStartCell_*>,_false> local_30;
  _Node_iterator_base<std::pair<const_int,_LASintervalStartCell_*>,_false> local_28;
  iterator hash_element;
  I32 c_index_local;
  LASinterval *this_local;
  
  hash_element.super__Node_iterator_base<std::pair<const_int,_LASintervalStartCell_*>,_false>._M_cur
  ._4_4_ = c_index;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_LASintervalStartCell_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>_>
       ::find((unordered_map<int,_LASintervalStartCell_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>_>
               *)this->cells,
              (key_type *)
              ((long)&hash_element.
                      super__Node_iterator_base<std::pair<const_int,_LASintervalStartCell_*>,_false>
                      ._M_cur + 4));
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_LASintervalStartCell_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>_>
       ::end((unordered_map<int,_LASintervalStartCell_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>_>
              *)this->cells);
  bVar1 = std::__detail::operator==(&local_28,&local_30);
  if (bVar1) {
    this->current_cell = (LASintervalCell *)0x0;
  }
  else {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_int,_LASintervalStartCell_*>,_false,_false>::operator*
                       ((_Node_iterator<std::pair<const_int,_LASintervalStartCell_*>,_false,_false>
                         *)&local_28);
    this->index = ppVar2->first;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_int,_LASintervalStartCell_*>,_false,_false>::operator*
                       ((_Node_iterator<std::pair<const_int,_LASintervalStartCell_*>,_false,_false>
                         *)&local_28);
    this->full = ppVar2->second->full;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_int,_LASintervalStartCell_*>,_false,_false>::operator*
                       ((_Node_iterator<std::pair<const_int,_LASintervalStartCell_*>,_false,_false>
                         *)&local_28);
    this->total = ppVar2->second->total;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_int,_LASintervalStartCell_*>,_false,_false>::operator*
                       ((_Node_iterator<std::pair<const_int,_LASintervalStartCell_*>,_false,_false>
                         *)&local_28);
    this->current_cell = &ppVar2->second->super_LASintervalCell;
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

BOOL LASinterval::get_cell(const I32 c_index)
{
  my_cell_hash::iterator hash_element = ((my_cell_hash*)cells)->find(c_index);
  if (hash_element == ((my_cell_hash*)cells)->end())
  {
    current_cell = 0;
    return FALSE;
  }
  index = (*hash_element).first;
  full = (*hash_element).second->full;
  total = (*hash_element).second->total;
  current_cell = (*hash_element).second;
  return TRUE;
}